

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

Aig_Man_t * Saig_Synchronize(Aig_Man_t *pAig1,Aig_Man_t *pAig2,int nWords,int fVerbose)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  Vec_Str_t *vSequence;
  void **__ptr;
  void **ppvVar4;
  Vec_Ptr_t *vSimInfo;
  Aig_Man_t *p0;
  Aig_Man_t *pAVar5;
  Aig_Man_t *p;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  Vec_Str_t *pVVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  timespec ts;
  timespec local_68;
  Vec_Str_t *local_58;
  Aig_Man_t *local_50;
  int local_44;
  long local_40;
  Aig_Man_t *local_38;
  
  if (fVerbose != 0) {
    printf("Design 1: ");
    Aig_ManPrintStats(pAig1);
    printf("Design 2: ");
    Aig_ManPrintStats(pAig2);
  }
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_58 = Saig_SynchSequence(pAig1,nWords);
  if (local_58 == (Vec_Str_t *)0x0) {
    iVar3 = 0x97c727;
    printf("Design 1: Synchronizing sequence is not found. ");
    if (fVerbose == 0) goto LAB_0067191d;
LAB_006718cd:
    Abc_Print(iVar3,"%s =","Time");
    iVar11 = 3;
    iVar3 = clock_gettime(3,&local_68);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
  }
  else {
    if (fVerbose != 0) {
      iVar3 = 0x97c757;
      printf("Design 1: Synchronizing sequence of length %4d is found. ",
             (long)local_58->nSize / (long)pAig1->nTruePis & 0xffffffff,
             (long)local_58->nSize % (long)pAig1->nTruePis & 0xffffffff);
      goto LAB_006718cd;
    }
LAB_0067191d:
    putchar(10);
  }
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  vSequence = Saig_SynchSequence(pAig2,nWords);
  pVVar10 = local_58;
  if (vSequence == (Vec_Str_t *)0x0) {
    iVar3 = 0x97c7e1;
    printf("Design 2: Synchronizing sequence is not found. ");
    pVVar10 = local_58;
    if (fVerbose == 0) goto LAB_00671a34;
  }
  else {
    if (fVerbose == 0) {
LAB_00671a34:
      pVVar10 = local_58;
      putchar(10);
      goto LAB_00671a68;
    }
    iVar3 = 0x97c811;
    printf("Design 2: Synchronizing sequence of length %4d is found. ",
           (long)vSequence->nSize / (long)pAig2->nTruePis & 0xffffffff,
           (long)vSequence->nSize % (long)pAig2->nTruePis & 0xffffffff);
  }
  Abc_Print(iVar3,"%s =","Time");
  iVar11 = 3;
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
LAB_00671a68:
  if (pVVar10 == (Vec_Str_t *)0x0 || vSequence == (Vec_Str_t *)0x0) {
    puts("Quitting synchronization.");
    if (pVVar10 != (Vec_Str_t *)0x0) {
      if (pVVar10->pArray != (char *)0x0) {
        free(pVVar10->pArray);
      }
      free(pVVar10);
    }
    if (vSequence != (Vec_Str_t *)0x0) {
      if (vSequence->pArray != (char *)0x0) {
        free(vSequence->pArray);
      }
      free(vSequence);
    }
    p = (Aig_Man_t *)0x0;
  }
  else {
    iVar3 = clock_gettime(3,&local_68);
    if (iVar3 < 0) {
      local_40 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
      local_40 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_68.tv_sec * -1000000;
    }
    uVar1 = pAig1->vObjs->nSize;
    uVar9 = pAig2->vObjs->nSize;
    if ((int)uVar9 < (int)uVar1) {
      uVar9 = uVar1;
    }
    local_50 = pAig1;
    local_38 = pAig2;
    __ptr = (void **)malloc((long)(int)uVar9 * 0xc);
    auVar2 = _DAT_008403e0;
    if (0 < (int)uVar9) {
      ppvVar4 = __ptr + (int)uVar9;
      uVar12 = (ulong)(uVar9 + 1 & 0xfffffffe);
      lVar7 = (ulong)uVar9 - 1;
      auVar13._8_4_ = (int)lVar7;
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
      ppvVar6 = __ptr + 1;
      auVar13 = auVar13 ^ _DAT_008403e0;
      auVar14 = _DAT_008403d0;
      do {
        auVar15 = auVar14 ^ auVar2;
        if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                    auVar13._4_4_ < auVar15._4_4_) & 1)) {
          ppvVar6[-1] = ppvVar4;
        }
        if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
            auVar15._12_4_ <= auVar13._12_4_) {
          *ppvVar6 = (void *)((long)ppvVar4 + 4);
        }
        lVar7 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 2;
        auVar14._8_8_ = lVar7 + 2;
        ppvVar6 = ppvVar6 + 2;
        ppvVar4 = ppvVar4 + 1;
        uVar12 = uVar12 - 2;
      } while (uVar12 != 0);
    }
    vSimInfo = (Vec_Ptr_t *)malloc(0x10);
    pAVar5 = local_50;
    vSimInfo->nSize = uVar9;
    vSimInfo->nCap = uVar9;
    vSimInfo->pArray = __ptr;
    iVar3 = Saig_SynchSequenceRun(local_50,vSimInfo,local_58,1);
    if (iVar3 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x274,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    iVar3 = Saig_SynchSequenceRun(pAVar5,vSimInfo,vSequence,0);
    pAVar5 = local_38;
    if (iVar3 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x276,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    local_44 = fVerbose;
    iVar3 = Saig_SynchSequenceRun(local_38,vSimInfo,vSequence,1);
    if (iVar3 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x27a,"Aig_Man_t *Saig_Synchronize(Aig_Man_t *, Aig_Man_t *, int, int)");
    }
    p0 = Saig_ManDupInitZero(local_50);
    pAVar5 = Saig_ManDupInitZero(pAVar5);
    p = Saig_ManCreateMiter(p0,pAVar5,0);
    Aig_ManCleanup(p);
    Aig_ManStop(p0);
    Aig_ManStop(pAVar5);
    if (__ptr != (void **)0x0) {
      free(__ptr);
    }
    free(vSimInfo);
    iVar3 = local_44;
    pVVar10 = local_58;
    if (local_58->pArray != (char *)0x0) {
      free(local_58->pArray);
    }
    free(pVVar10);
    pAVar5 = local_50;
    if (vSequence->pArray != (char *)0x0) {
      free(vSequence->pArray);
    }
    free(vSequence);
    Aig_ManCleanMarkA(pAVar5);
    Aig_ManCleanMarkA(local_38);
    if (iVar3 != 0) {
      iVar3 = 0x97c88b;
      printf("Miter of the synchronized designs is constructed.         ");
      Abc_Print(iVar3,"%s =","Time");
      iVar11 = 3;
      iVar3 = clock_gettime(3,&local_68);
      if (iVar3 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar7 + local_40) / 1000000.0);
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_Synchronize( Aig_Man_t * pAig1, Aig_Man_t * pAig2, int nWords, int fVerbose )
{
    Aig_Man_t * pAig1z, * pAig2z, * pMiter;
    Vec_Str_t * vSeq1, * vSeq2;
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clk;
/*
    {
        unsigned u = Saig_SynchRandomTernary();
        unsigned w = Saig_SynchRandomTernary();
        unsigned x = Saig_SynchNot( u );
        unsigned y = Saig_SynchNot( w );
        unsigned z = Saig_SynchAnd( x, y );

        Extra_PrintBinary( stdout, &u, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &w, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &x, 32 );  printf( "\n" );
        Extra_PrintBinary( stdout, &y, 32 );  printf( "\n" );  printf( "\n" );
        Extra_PrintBinary( stdout, &z, 32 );  printf( "\n" );
    }
*/
    // report statistics
    if ( fVerbose )
    {
        printf( "Design 1: " );
        Aig_ManPrintStats( pAig1 );
        printf( "Design 2: " );
        Aig_ManPrintStats( pAig2 );
    }

    // synchronize the first design
    clk = Abc_Clock();
    vSeq1 = Saig_SynchSequence( pAig1, nWords );
    if ( vSeq1 == NULL )
        printf( "Design 1: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 1: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq1) / Saig_ManPiNum(pAig1) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // synchronize the first design
    clk = Abc_Clock();
    vSeq2 = Saig_SynchSequence( pAig2, nWords );
    if ( vSeq2 == NULL )
        printf( "Design 2: Synchronizing sequence is not found. " );
    else if ( fVerbose )
        printf( "Design 2: Synchronizing sequence of length %4d is found. ", Vec_StrSize(vSeq2) / Saig_ManPiNum(pAig2) );
    if ( fVerbose )
    {
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
        printf( "\n" );

    // quit if one of the designs cannot be synchronized
    if ( vSeq1 == NULL || vSeq2 == NULL )
    {
        printf( "Quitting synchronization.\n" );
        if ( vSeq1 ) Vec_StrFree( vSeq1 );
        if ( vSeq2 ) Vec_StrFree( vSeq2 );
        return NULL;
    }
    clk = Abc_Clock();
    vSimInfo = Vec_PtrAllocSimInfo( Abc_MaxInt( Aig_ManObjNumMax(pAig1), Aig_ManObjNumMax(pAig2) ), 1 );

    // process Design 1
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq1, 1 );
    assert( RetValue == 0 );
    RetValue = Saig_SynchSequenceRun( pAig1, vSimInfo, vSeq2, 0 );
    assert( RetValue == 0 );

    // process Design 2
    RetValue = Saig_SynchSequenceRun( pAig2, vSimInfo, vSeq2, 1 );
    assert( RetValue == 0 );

    // duplicate designs
    pAig1z = Saig_ManDupInitZero( pAig1 );
    pAig2z = Saig_ManDupInitZero( pAig2 );
    pMiter = Saig_ManCreateMiter( pAig1z, pAig2z, 0 );
    Aig_ManCleanup( pMiter );
    Aig_ManStop( pAig1z );
    Aig_ManStop( pAig2z );

    // cleanup
    Vec_PtrFree( vSimInfo );
    Vec_StrFree( vSeq1 );
    Vec_StrFree( vSeq2 );
    Aig_ManCleanMarkA( pAig1 );
    Aig_ManCleanMarkA( pAig2 );

    if ( fVerbose )
    {
        printf( "Miter of the synchronized designs is constructed.         " );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return pMiter;
}